

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O1

cmList * __thiscall
cmList::transform(cmList *this,TransformAction action,
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *args,unique_ptr<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_>
                       *selector)

{
  TransformSelector *pTVar1;
  iterator descriptor;
  _Base_ptr *local_48;
  undefined8 uStack_40;
  code *local_38;
  code *pcStack_30;
  _Base_ptr local_28;
  
  local_28 = (_Base_ptr)
             anon_unknown.dwarf_156cac::TransformConfigure
                       (action,selector,
                        (long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 5);
  (**(code **)(*(long *)local_28[2]._M_left + 0x20))
            (local_28[2]._M_left,
             (selector->_M_t).
             super___uniq_ptr_impl<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmList::TransformSelector_*,_std::default_delete<cmList::TransformSelector>_>
             .super__Head_base<0UL,_cmList::TransformSelector_*,_false>._M_head_impl,args);
  pTVar1 = (selector->_M_t).
           super___uniq_ptr_impl<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmList::TransformSelector_*,_std::default_delete<cmList::TransformSelector>_>
           .super__Head_base<0UL,_cmList::TransformSelector_*,_false>._M_head_impl;
  uStack_40 = 0;
  pcStack_30 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmList.cxx:799:19)>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmList.cxx:799:19)>
             ::_M_manager;
  local_48 = &local_28;
  (*pTVar1->_vptr_TransformSelector[5])(pTVar1,this);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,3);
  }
  return this;
}

Assistant:

cmList& cmList::transform(TransformAction action,
                          std::vector<std::string> const& args,
                          std::unique_ptr<TransformSelector> selector)
{
  auto descriptor = TransformConfigure(action, selector, args.size());

  descriptor->Transform->Initialize(
    static_cast<::TransformSelector*>(selector.get()), args);

  static_cast<::TransformSelector&>(*selector).Transform(
    this->Values, [&descriptor](const std::string& s) -> std::string {
      return (*descriptor->Transform)(s);
    });

  return *this;
}